

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.c
# Opt level: O0

void lr_sync_write(void *lr_sync,int r,int c,int sb_cols,int plane)

{
  bool bVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int sig;
  int cur;
  int nsync;
  AV1LrSync *loop_res_sync;
  int local_30;
  int local_28;
  
  bVar1 = in_ECX + -1 <= in_EDX;
  local_28 = in_EDX;
  if (bVar1) {
    local_28 = in_ECX + *(int *)(in_RDI + 0x48);
  }
  if (bVar1 || in_EDX % *(int *)(in_RDI + 0x48) == 0) {
    pthread_mutex_lock((pthread_mutex_t *)
                       (*(long *)(in_RDI + (long)in_R8D * 8) + (long)in_ESI * 0x28));
    if (local_28 < *(int *)(*(long *)(in_RDI + 0x30 + (long)in_R8D * 8) + (long)in_ESI * 4)) {
      local_30 = *(int *)(*(long *)(in_RDI + 0x30 + (long)in_R8D * 8) + (long)in_ESI * 4);
    }
    else {
      local_30 = local_28;
    }
    *(int *)(*(long *)(in_RDI + 0x30 + (long)in_R8D * 8) + (long)in_ESI * 4) = local_30;
    pthread_cond_broadcast
              ((pthread_cond_t *)(*(long *)(in_RDI + 0x18 + (long)in_R8D * 8) + (long)in_ESI * 0x30)
              );
    pthread_mutex_unlock
              ((pthread_mutex_t *)(*(long *)(in_RDI + (long)in_R8D * 8) + (long)in_ESI * 0x28));
  }
  return;
}

Assistant:

static inline void lr_sync_write(void *const lr_sync, int r, int c,
                                 const int sb_cols, int plane) {
#if CONFIG_MULTITHREAD
  AV1LrSync *const loop_res_sync = (AV1LrSync *)lr_sync;
  const int nsync = loop_res_sync->sync_range;
  int cur;
  // Only signal when there are enough filtered SB for next row to run.
  int sig = 1;

  if (c < sb_cols - 1) {
    cur = c;
    if (c % nsync) sig = 0;
  } else {
    cur = sb_cols + nsync;
  }

  if (sig) {
    pthread_mutex_lock(&loop_res_sync->mutex_[plane][r]);

    // When a thread encounters an error, cur_sb_col[plane][r] is set to maximum
    // column number. In this case, the AOMMAX operation here ensures that
    // cur_sb_col[plane][r] is not overwritten with a smaller value thus
    // preventing the infinite waiting of threads in the relevant sync_read()
    // function.
    loop_res_sync->cur_sb_col[plane][r] =
        AOMMAX(loop_res_sync->cur_sb_col[plane][r], cur);

    pthread_cond_broadcast(&loop_res_sync->cond_[plane][r]);
    pthread_mutex_unlock(&loop_res_sync->mutex_[plane][r]);
  }
#else
  (void)lr_sync;
  (void)r;
  (void)c;
  (void)sb_cols;
  (void)plane;
#endif  // CONFIG_MULTITHREAD
}